

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 SyUriDecode(char *zSrc,sxu32 nLen,ProcConsumer xConsumer,void *pUserData,int bUTF8)

{
  char cVar1;
  bool bVar2;
  long lVar3;
  undefined1 uVar4;
  int in_EAX;
  uint uVar5;
  ulong uVar6;
  char *pcVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  char *pcVar11;
  sxu8 zOut [10];
  undefined4 local_3c;
  undefined1 local_38 [8];
  
  pcVar11 = zSrc + nLen;
  do {
    if (pcVar11 <= zSrc) {
      return in_EAX;
    }
    uVar6 = 0;
    do {
      if ((zSrc[uVar6] == '%') || (zSrc[uVar6] == '+')) {
        pcVar7 = zSrc + uVar6;
        if (uVar6 == 0) goto LAB_00122b08;
        bVar2 = false;
        goto LAB_00122aec;
      }
      lVar3 = uVar6 + 1;
      uVar6 = uVar6 + 1;
    } while (zSrc + lVar3 < pcVar11);
    pcVar7 = zSrc + uVar6;
    bVar2 = true;
LAB_00122aec:
    uVar5 = (*xConsumer)(zSrc,(int)pcVar7 - (int)zSrc,pUserData);
    uVar6 = (ulong)uVar5;
    if (bVar2) {
      return uVar5;
    }
    if (uVar5 != 0) {
      return uVar5;
    }
LAB_00122b08:
    if (*pcVar7 == '+') {
      local_3c = CONCAT31(local_3c._1_3_,0x20);
      zSrc = pcVar7 + 1;
LAB_00122c37:
      iVar9 = (int)&local_3c + 1;
    }
    else {
      if (pcVar11 <= pcVar7 + 2) {
        return (sxi32)uVar6;
      }
      iVar9 = (int)pcVar7[1];
      if (iVar9 - 0x61U < 6) {
        uVar5 = iVar9 - 0x57;
      }
      else {
        uVar5 = iVar9 - 0x30;
        if ((9 < uVar5) && (uVar5 = iVar9 - 0x37, 5 < iVar9 - 0x41U)) {
          uVar5 = 0;
        }
      }
      iVar9 = (int)pcVar7[2];
      if (iVar9 - 0x61U < 6) {
        uVar8 = iVar9 - 0x57;
      }
      else {
        uVar8 = iVar9 - 0x30;
        if ((9 < uVar8) && (uVar8 = iVar9 - 0x37, 5 < iVar9 - 0x41U)) {
          uVar8 = 0;
        }
      }
      iVar9 = uVar5 * 0x10 + uVar8;
      zSrc = pcVar7 + 3;
      if (uVar5 < 0xc) {
        local_3c = CONCAT31(local_3c._1_3_,(char)iVar9);
        goto LAB_00122c37;
      }
      uVar5 = (uint)""[iVar9 - 0xc0];
      cVar1 = *zSrc;
      while (cVar1 == '%') {
        iVar9 = (int)zSrc[1];
        if (iVar9 - 0x61U < 6) {
          uVar8 = iVar9 - 0x57;
        }
        else {
          uVar8 = iVar9 - 0x30;
          if ((9 < uVar8) && (uVar8 = iVar9 - 0x37, 5 < iVar9 - 0x41U)) {
            uVar8 = 0;
          }
        }
        iVar9 = (int)zSrc[2];
        if (iVar9 - 0x61U < 6) {
          uVar10 = iVar9 - 0x57;
        }
        else {
          uVar10 = iVar9 - 0x30;
          if ((9 < uVar10) && (uVar10 = iVar9 - 0x37, 5 < iVar9 - 0x41U)) {
            uVar10 = 0;
          }
        }
        if ((uVar8 & 0xc) != 8) break;
        uVar5 = uVar5 * 0x40 + ((uVar8 & 3) << 4 | uVar10);
        cVar1 = zSrc[3];
        zSrc = zSrc + 3;
      }
      uVar4 = (undefined1)uVar5;
      if ((int)uVar5 < 0x80) {
        local_3c = CONCAT31(local_3c._1_3_,uVar4);
        goto LAB_00122c37;
      }
      if (uVar5 < 0x800) {
        local_3c = CONCAT22(local_3c._2_2_,CONCAT11(uVar4,(char)(uVar5 >> 6))) & 0xffff3fff | 0x80c0
        ;
        iVar9 = (int)&local_3c + 2;
      }
      else if (uVar5 < 0x10000) {
        uVar5 = CONCAT22(local_3c._2_2_,CONCAT11((char)(uVar5 >> 6),(char)(uVar5 >> 0xc))) &
                0xffff3fff;
        local_3c._3_1_ = (undefined1)(uVar5 >> 0x18);
        local_3c = CONCAT13(local_3c._3_1_,CONCAT12(uVar4,(short)uVar5)) & 0xff3fffff | 0x8080e0;
        iVar9 = (int)&local_3c + 3;
      }
      else {
        local_3c = (uVar5 << 0x18 |
                   (uVar5 & 0x3fc0) << 10 | uVar5 >> 0x12 & 0xff | uVar5 >> 4 & 0xff00) &
                   (uint)DAT_00142970 | (uint)DAT_00142980;
        iVar9 = (int)local_38;
      }
    }
    in_EAX = (*xConsumer)(&local_3c,iVar9 - (int)&local_3c,pUserData);
    if (in_EAX != 0) {
      return in_EAX;
    }
  } while( true );
}

Assistant:

JX9_PRIVATE sxi32 SyUriDecode(const char *zSrc, sxu32 nLen, ProcConsumer xConsumer, void *pUserData, int bUTF8)
{
	static const sxu8 Utf8Trans[] = {
		0x00, 0x01, 0x02, 0x03, 0x04, 0x05, 0x06, 0x07, 
		0x08, 0x09, 0x0a, 0x0b, 0x0c, 0x0d, 0x0e, 0x0f, 
		0x10, 0x11, 0x12, 0x13, 0x14, 0x15, 0x16, 0x17, 
		0x18, 0x19, 0x1a, 0x1b, 0x1c, 0x1d, 0x1e, 0x1f, 
		0x00, 0x01, 0x02, 0x03, 0x04, 0x05, 0x06, 0x07, 
		0x08, 0x09, 0x0a, 0x0b, 0x0c, 0x0d, 0x0e, 0x0f, 
		0x00, 0x01, 0x02, 0x03, 0x04, 0x05, 0x06, 0x07, 
		0x00, 0x01, 0x02, 0x03, 0x00, 0x01, 0x00, 0x00
	};
	const char *zIn = zSrc;
	const char *zEnd;
	const char *zCur;
	sxu8 *zOutPtr;
	sxu8 zOut[10];
	sxi32 c, d;
	sxi32 rc;
#if defined(UNTRUST)
	if( SX_EMPTY_STR(zSrc) || xConsumer == 0 ){
		return SXERR_EMPTY;
	}
#endif
	rc = SXRET_OK;
	zEnd = &zSrc[nLen];
	zCur = zIn;
	for(;;){
		while(zCur < zEnd && zCur[0] != '%' && zCur[0] != '+' ){
			zCur++;
		}
		if( zCur != zIn ){
			/* Consume input */
			rc = xConsumer(zIn, (unsigned int)(zCur-zIn), pUserData);
			if( rc != SXRET_OK ){
				/* User consumer routine request an operation abort */
				break;
			}
		}
		if( zCur >= zEnd ){
			rc = SXRET_OK;
			break;
		}
		/* Decode unsafe HTTP characters */
		zOutPtr = zOut;
		if( zCur[0] == '+' ){
			*zOutPtr++ = ' ';
			zCur++;
		}else{
			if( &zCur[2] >= zEnd ){
				rc = SXERR_OVERFLOW;
				break;
			}
			c = (SyAsciiToHex(zCur[1]) <<4) | SyAsciiToHex(zCur[2]);
			zCur += 3;
			if( c < 0x000C0 ){
				*zOutPtr++ = (sxu8)c;
			}else{
				c = Utf8Trans[c-0xC0];
				while( zCur[0] == '%' ){
					d = (SyAsciiToHex(zCur[1]) <<4) | SyAsciiToHex(zCur[2]);
					if( (d&0xC0) != 0x80 ){
						break;
					}
					c = (c<<6) + (0x3f & d);
					zCur += 3;
				}
				if( bUTF8 == FALSE ){
					*zOutPtr++ = (sxu8)c;
				}else{
					SX_WRITE_UTF8(zOutPtr, c);
				}
			}
			
		}
		/* Consume the decoded characters */
		rc = xConsumer((const void *)zOut, (unsigned int)(zOutPtr-zOut), pUserData);
		if( rc != SXRET_OK ){
			break;
		}
		/* Synchronize pointers */
		zIn = zCur;
	}
	return rc;
}